

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                    sqlite3_value **apVal)

{
  sqlite3_stmt **ppStmt;
  Fts3Table *pFVar1;
  sqlite3_vtab *psVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  sqlite3_int64 sVar10;
  byte *pbVar11;
  ulong uVar12;
  Fts3Expr *pFVar13;
  size_t sVar14;
  ulong uVar15;
  Fts3Expr *pFVar16;
  Fts3Expr *pNew;
  Fts3Expr *pFVar17;
  Fts3TokenAndCost *aTC;
  char *pcVar18;
  Mem *pMem;
  byte *zRight;
  Fts3Expr **ppFVar19;
  byte *pbVar20;
  Fts3Cursor *pCursor_00;
  long lVar21;
  Fts3TokenAndCost *pFVar22;
  sqlite3_value *psVar23;
  uint uVar24;
  long lVar25;
  sqlite3_tokenizer_module *psVar26;
  Fts3Phrase *pFVar27;
  long lVar28;
  ulong uVar29;
  u8 uVar30;
  bool bVar31;
  Fts3Expr *local_120;
  int nByte;
  Fts3Cursor *local_110;
  ulong local_108;
  int iBegin;
  byte *local_f8;
  Fts3Expr *local_f0;
  uint local_e8;
  int iEnd;
  sqlite3_tokenizer_cursor *local_e0;
  byte *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  Fts3Expr *local_c0;
  Fts3Expr *local_b8;
  uint local_b0;
  uint local_ac;
  sqlite3_tokenizer_cursor *pCursor_1;
  Fts3Table *local_a0;
  uint local_98;
  int local_94;
  sqlite3_tokenizer_module *local_90;
  char *zByte;
  i64 local_80;
  sqlite3_value *local_78;
  sqlite3_tokenizer *local_70;
  Fts3Expr **local_68;
  sqlite3_value *local_60;
  sqlite3_value *local_58;
  byte *local_50;
  ulong local_48;
  char **local_40;
  ulong local_38;
  
  local_ac = idxNum & 0xffff;
  if (local_ac == 0) {
    local_60 = (sqlite3_value *)0x0;
  }
  else {
    local_60 = *apVal;
  }
  bVar3 = local_ac != 0;
  uVar12 = (ulong)bVar3;
  if (((uint)idxNum >> 0x10 & 1) == 0) {
    pMem = (Mem *)0x0;
    uVar29 = uVar12;
  }
  else {
    uVar29 = (ulong)(bVar3 + 1);
    pMem = apVal[uVar12];
  }
  uVar7 = (uint)uVar29;
  if (((uint)idxNum >> 0x11 & 1) == 0) {
    local_78 = (sqlite3_value *)0x0;
  }
  else {
    uVar7 = uVar7 + 1;
    local_78 = apVal[uVar29];
  }
  if (((uint)idxNum >> 0x12 & 1) == 0) {
    psVar23 = (sqlite3_value *)0x0;
  }
  else {
    psVar23 = apVal[uVar7];
  }
  pFVar1 = (Fts3Table *)pCursor->pVtab;
  local_110 = (Fts3Cursor *)pCursor;
  local_98 = idxNum;
  sqlite3_finalize((sqlite3_stmt *)pCursor[2].pVtab);
  sqlite3_free(local_110->aDoclist);
  sqlite3_free(local_110->aMatchinfo);
  sqlite3Fts3ExprFree(local_110->pExpr);
  memset(&local_110->eSearch,0,0x88);
  sVar10 = fts3DocidRange(local_78,-0x8000000000000000);
  local_110->iMinDocid = sVar10;
  local_58 = psVar23;
  sVar10 = fts3DocidRange(psVar23,0x7fffffffffffffff);
  psVar23 = local_60;
  local_110->iMaxDocid = sVar10;
  if (idxStr == (char *)0x0) {
    uVar30 = pFVar1->bDescIdx;
  }
  else {
    uVar30 = *idxStr == 'D';
  }
  local_110->bDesc = uVar30;
  local_110->eSearch = (i16)local_98;
  pCursor_00 = local_110;
  local_a0 = pFVar1;
  if (1 < local_ac) {
    pbVar11 = sqlite3_value_text(local_60);
    if ((pbVar11 == (byte *)0x0) &&
       (uVar7._0_2_ = psVar23->flags, uVar7._2_1_ = psVar23->enc, uVar7._3_1_ = psVar23->field_0xb,
       (0xaaaaaaaaU >> (uVar7 & 0x1f) & 1) == 0)) {
      return 7;
    }
    local_110->iLangid = 0;
    if (pMem == (Mem *)0x0) {
      local_80 = 0;
    }
    else {
      local_80 = sqlite3VdbeIntValue(pMem);
      local_110->iLangid = (int)local_80;
    }
    if (pbVar11 == (byte *)0x0) {
      local_110->pExpr = (Fts3Expr *)0x0;
      pFVar16 = (Fts3Expr *)0x0;
    }
    else {
      local_ac = local_ac - 2;
      local_40 = local_a0->azColumn;
      local_70 = local_a0->pTokenizer;
      uVar7 = local_a0->nColumn;
      uVar30 = local_a0->bFts4;
      local_68 = &local_110->pExpr;
      uVar12 = strlen((char *)pbVar11);
      local_d0 = (Fts3Expr *)0x0;
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      local_38 = (ulong)uVar7;
      uVar7 = 0;
      local_e8 = 1;
      local_f0 = (Fts3Expr *)0x0;
      pbVar20 = pbVar11;
      pFVar16 = (Fts3Expr *)0x0;
      local_f8 = pbVar11;
      local_b0 = local_e8;
      while (ppFVar19 = local_68, uVar7 == 0) {
        uVar29 = uVar12 & 0xffffffff;
        zRight = pbVar20;
        while (iVar9 = (int)uVar29, local_d8 = pbVar20, local_c0 = pFVar16, 0 < iVar9) {
          if ((0x20 < (ulong)*zRight) || ((0x100003e00U >> ((ulong)*zRight & 0x3f) & 1) == 0))
          goto LAB_0016a323;
          zRight = zRight + 1;
          uVar29 = (ulong)(iVar9 - 1);
        }
        iVar5 = 0;
        iVar9 = (int)uVar12;
        if ((int)uVar12 < 0) {
LAB_0016a323:
          local_120._0_4_ = (int)zRight - (int)pbVar20;
          local_b8 = (Fts3Expr *)0x0;
          local_e0 = (sqlite3_tokenizer_cursor *)((ulong)local_e0 & 0xffffffff00000000);
          local_108 = uVar12;
          for (lVar28 = 0; pbVar11 = local_f8, lVar28 != 4; lVar28 = lVar28 + 1) {
            lVar25 = lVar28 * 0x10;
            if ((&DAT_001a5c69)[lVar25] == '\0') {
              uVar29 = (ulong)(byte)(&DAT_001a5c68)[lVar25];
              if (((int)(uint)(byte)(&DAT_001a5c68)[lVar25] <= iVar9) &&
                 (iVar5 = bcmp(zRight,(&getNextNode_aKeyword)[lVar28 * 2],uVar29), iVar5 == 0)) {
                if (((byte)(&DAT_001a5c6a)[lVar25] == 1) && (zRight[4] == 0x2f)) {
                  bVar4 = zRight[5];
                  iVar5 = 10;
                  if ((byte)(bVar4 - 0x30) < 10) {
                    iVar5 = 0;
                    lVar21 = 6;
                    while ((byte)(bVar4 - 0x30) < 10) {
                      iVar5 = (uint)(byte)(bVar4 - 0x30) + iVar5 * 10;
                      pbVar11 = zRight + lVar21;
                      lVar21 = lVar21 + 1;
                      bVar4 = *pbVar11;
                    }
                    uVar29 = (ulong)((int)lVar21 - 1);
                  }
                }
                else {
                  iVar5 = 10;
                }
                bVar4 = zRight[uVar29];
                uVar15 = (ulong)bVar4;
                if ((uVar15 < 0x2a) && ((0x30500003e01U >> (uVar15 & 0x3f) & 1) != 0)) {
                  local_90 = (sqlite3_tokenizer_module *)(0x30400000001 >> (bVar4 & 0x3f));
                  local_c8._0_4_ = (uint)(byte)(&DAT_001a5c6a)[lVar25];
                  pFVar13 = (Fts3Expr *)fts3MallocZero(0x40);
                  iVar6 = (int)local_108;
                  pbVar11 = local_f8;
                  if (pFVar13 == (Fts3Expr *)0x0) {
                    local_c8 = (sqlite3_tokenizer_module *)CONCAT44(local_c8._4_4_,7);
                    if (((ulong)local_90 & 1) == 0) {
                      uVar7 = 7;
                      pbVar20 = local_d8;
                      pFVar17 = local_c0;
                      iVar5 = (int)local_e0;
                      goto LAB_0016ab7b;
                    }
                  }
                  else {
                    pFVar13->eType = (uint)local_c8;
                    pFVar13->nNear = iVar5;
                    iVar5 = (int)uVar29 + (int)local_120;
                    local_c8 = (sqlite3_tokenizer_module *)((ulong)local_c8._4_4_ << 0x20);
                    if (((ulong)local_90 & 1) == 0) {
                      bVar3 = true;
                      uVar7 = 0;
                      pFVar16 = local_c0;
                      goto LAB_0016ab3d;
                    }
                    local_e0 = (sqlite3_tokenizer_cursor *)CONCAT44(local_e0._4_4_,iVar5);
                    local_b8 = pFVar13;
                  }
                }
                iVar6 = (int)local_108;
                uVar12 = local_108;
                if ((bVar4 < 0x2a) && ((0x30400000001U >> (uVar15 & 0x3f) & 1) != 0)) {
                  bVar3 = true;
                  pbVar11 = local_f8;
                  pFVar13 = local_b8;
                  pFVar16 = local_c0;
                  iVar5 = (int)local_e0;
                  uVar7 = (uint)local_c8;
                  goto LAB_0016ab3d;
                }
              }
            }
          }
          if (*zRight == 0x22) {
            iVar6 = 1;
            if (1 < iVar9) {
              iVar6 = iVar9;
            }
            for (lVar28 = 1; lVar28 < iVar9; lVar28 = lVar28 + 1) {
              if (zRight[lVar28] == 0x22) {
                iVar6 = (int)lVar28;
                break;
              }
            }
            iVar5 = (int)local_120 + iVar6 + 1;
            if (iVar6 == iVar9) {
              uVar7 = 1;
              goto LAB_0016a312;
            }
            psVar26 = local_70->pModule;
            pCursor_1 = (sqlite3_tokenizer_cursor *)0x0;
            uVar7 = sqlite3Fts3OpenTokenizer
                              (local_70,(int)local_80,(char *)(zRight + 1),iVar6 - 1U,&pCursor_1);
            local_90 = psVar26;
            if (uVar7 == 0) {
              uVar29 = 0;
              local_120 = (Fts3Expr *)0x0;
              local_b8 = (Fts3Expr *)0x0;
              local_e0 = (sqlite3_tokenizer_cursor *)0x0;
              local_c8 = (sqlite3_tokenizer_module *)((ulong)local_c8 & 0xffffffff00000000);
              uVar12 = 0;
              local_50 = zRight + 1;
              local_48 = (ulong)(iVar6 - 1U);
              while( true ) {
                iVar9 = (int)uVar12;
                uVar7 = (uint)local_c8;
                if ((uint)local_c8 != 0) break;
                nByte = 0;
                iBegin = 0;
                iEnd = 0;
                local_94 = 0;
                iVar9 = (*psVar26->xNext)(pCursor_1,&zByte,&nByte,&iBegin,&iEnd,&local_94);
                local_c8 = (sqlite3_tokenizer_module *)CONCAT44(local_c8._4_4_,iVar9);
                if (iVar9 == 0) {
                  local_120 = (Fts3Expr *)fts3ReallocOrFree(local_120,(int)uVar29 * 0x28 + 0xc0);
                  pFVar13 = local_b8;
                  if (local_120 == (Fts3Expr *)0x0) {
LAB_0016aaf2:
                    iVar6 = (int)local_108;
                    goto LAB_0016ab01;
                  }
                  iVar9 = (int)local_e0;
                  pFVar16 = (Fts3Expr *)fts3ReallocOrFree(local_b8,nByte + iVar9);
                  if (pFVar16 == (Fts3Expr *)0x0) {
                    pFVar13 = (Fts3Expr *)0x0;
                    goto LAB_0016aaf2;
                  }
                  (&local_120[2].iDocid)[uVar29 * 5] = 0;
                  (&local_120[2].iDocid + uVar29 * 5)[1] = 0;
                  (&local_120[2].pRight)[uVar29 * 5] = (Fts3Expr *)0x0;
                  (&local_120[2].pRight + uVar29 * 5)[1] = (Fts3Expr *)0x0;
                  (&local_120[2].aMI)[uVar29 * 5] = (u32 *)0x0;
                  local_b8 = pFVar16;
                  memcpy((void *)((long)&pFVar16->eType + (long)iVar9),zByte,(long)nByte);
                  *(int *)(&local_120[2].pPhrase + uVar29 * 5) = nByte;
                  uVar7 = 0;
                  uVar24 = 0;
                  if (iEnd < (int)local_48) {
                    uVar24 = (uint)(local_50[iEnd] == 0x2a);
                  }
                  *(uint *)((long)&local_120[2].pPhrase + uVar29 * 0x28 + 4) = uVar24;
                  if (0 < (long)iBegin) {
                    uVar7 = (uint)(zRight[iBegin] == 0x5e);
                  }
                  local_e0 = (sqlite3_tokenizer_cursor *)(ulong)(uint)((int)local_e0 + nByte);
                  *(uint *)(&local_120[2].iDocid + uVar29 * 5) = uVar7;
                  uVar29 = uVar29 + 1;
                  uVar12 = uVar29 & 0xffffffff;
                  psVar26 = local_90;
                }
                else {
                  uVar29 = uVar29 + 1;
                }
              }
              (*psVar26->xClose)(pCursor_1);
              pCursor_1 = (sqlite3_tokenizer_cursor *)0x0;
              iVar6 = (int)local_e0;
              pbVar11 = local_f8;
            }
            else {
              local_120 = (Fts3Expr *)0x0;
              local_b8 = (Fts3Expr *)0x0;
              iVar6 = 0;
              iVar9 = 0;
            }
            if (uVar7 == 0x65) {
              pFVar13 = (Fts3Expr *)fts3ReallocOrFree(local_120,iVar9 * 0x28 + iVar6 + 0xc0);
              if (pFVar13 == (Fts3Expr *)0x0) {
                local_120 = (Fts3Expr *)0x0;
                iVar6 = (int)local_108;
                pFVar13 = local_b8;
LAB_0016ab01:
                pFVar16 = local_c0;
                if (pCursor_1 != (sqlite3_tokenizer_cursor *)0x0) {
                  (*local_90->xClose)(pCursor_1);
                }
                sqlite3_free(pFVar13);
                sqlite3_free(local_120);
                pFVar13 = (Fts3Expr *)0x0;
                uVar7 = 7;
                pbVar11 = local_f8;
              }
              else {
                pFVar27 = (Fts3Phrase *)(pFVar13 + 1);
                memset(pFVar13,0,0x90);
                pFVar16 = local_b8;
                pFVar13->eType = 5;
                pFVar13->pPhrase = pFVar27;
                *(uint *)((long)&pFVar13[2].pLeft + 4) = local_ac;
                *(int *)&pFVar13[2].pLeft = iVar9;
                ppFVar19 = &pFVar13[2].pRight + (long)iVar9 * 5;
                if (local_b8 != (Fts3Expr *)0x0) {
                  memcpy(ppFVar19,local_b8,(long)iVar6);
                  sqlite3_free(pFVar16);
                  pFVar27 = pFVar13->pPhrase;
                }
                uVar12 = (ulong)(uint)pFVar27->nToken;
                if (pFVar27->nToken < 1) {
                  uVar12 = 0;
                }
                iVar6 = (int)local_108;
                for (lVar28 = 0; uVar12 * 0x28 - lVar28 != 0; lVar28 = lVar28 + 0x28) {
                  *(Fts3Expr ***)((long)&pFVar27->aToken[0].z + lVar28) = ppFVar19;
                  ppFVar19 = (Fts3Expr **)
                             ((long)ppFVar19 + (long)*(int *)((long)&pFVar27->aToken[0].n + lVar28))
                  ;
                }
                uVar7 = 0;
                pbVar11 = local_f8;
                pFVar16 = local_c0;
              }
            }
            else {
              iVar6 = (int)local_108;
              pFVar13 = local_120;
              pFVar16 = local_c0;
            }
            bVar3 = true;
          }
          else {
            for (uVar12 = 0; local_38 != uVar12; uVar12 = uVar12 + 1) {
              pcVar18 = local_40[uVar12];
              sVar14 = strlen(pcVar18);
              iVar5 = (int)sVar14;
              if (((iVar5 < iVar9) && (zRight[iVar5] == 0x3a)) &&
                 (iVar6 = sqlite3_strnicmp(pcVar18,(char *)zRight,iVar5), iVar6 == 0)) {
                iVar9 = iVar5 + (int)local_120 + 1;
                goto LAB_0016a54a;
              }
            }
            iVar9 = 0;
            uVar12 = (ulong)local_ac;
LAB_0016a54a:
            pbVar11 = local_d8 + iVar9;
            uVar24 = (int)local_108 - iVar9;
            local_c8 = local_70->pModule;
            uVar29 = 0;
            if (0 < (int)uVar24) {
              uVar29 = (ulong)uVar24;
            }
            for (uVar15 = 0; uVar29 != uVar15; uVar15 = uVar15 + 1) {
              if (pbVar11[uVar15] == 0x22) {
                uVar29 = uVar15 & 0xffffffff;
                break;
              }
            }
            iVar5 = (int)uVar29;
            uVar7 = sqlite3Fts3OpenTokenizer
                              (local_70,(int)local_80,(char *)pbVar11,iVar5,&pCursor_1);
            if (uVar7 == 0) {
              nByte = 0;
              iBegin = 0;
              iEnd = 0;
              local_94 = 0;
              local_e0 = pCursor_1;
              uVar8 = (*local_c8->xNext)(pCursor_1,&zByte,&nByte,&iBegin,&iEnd,&local_94);
              if (uVar8 == 0) {
                pFVar13 = (Fts3Expr *)fts3MallocZero(nByte + 0xc0);
                if (pFVar13 == (Fts3Expr *)0x0) {
                  iVar5 = iEnd;
                  uVar7 = 7;
                  goto LAB_0016a6e5;
                }
                pFVar13->eType = 5;
                pFVar13->pPhrase = (Fts3Phrase *)(pFVar13 + 1);
                *(undefined4 *)&pFVar13[2].pLeft = 1;
                *(int *)((long)&pFVar13[2].pLeft + 4) = (int)uVar12;
                *(int *)&pFVar13[2].pPhrase = nByte;
                pFVar13[2].pRight = pFVar13 + 3;
                memcpy(pFVar13 + 3,zByte,(long)nByte);
                if ((iEnd < (int)uVar24) && (pbVar11[iEnd] == 0x2a)) {
                  *(undefined4 *)((long)&pFVar13[2].pPhrase + 4) = 1;
                  iEnd = iEnd + 1;
                }
                iVar6 = (int)local_108;
                uVar12 = (ulong)(uint)iBegin;
                bVar3 = false;
                while (0 < (int)uVar12) {
                  bVar31 = true;
                  if (pbVar11[uVar12 - 1] != 0x2d) {
                    if ((uVar30 == '\0') || (pbVar11[uVar12 - 1] != 0x5e)) break;
                    *(undefined4 *)&pFVar13[2].iDocid = 1;
                    bVar31 = bVar3;
                  }
                  bVar3 = bVar31;
                  uVar12 = uVar12 - 1;
                  iBegin = (int)uVar12;
                }
                bVar3 = !bVar3;
                uVar7 = 0;
                iVar5 = iEnd;
              }
              else {
                uVar7 = uVar8;
                if (uVar8 == 0x65) {
                  uVar7 = 0;
                }
                if (iVar5 == 0) {
                  uVar7 = uVar8;
                }
LAB_0016a6e5:
                pFVar13 = (Fts3Expr *)0x0;
                bVar3 = true;
                iVar6 = (int)local_108;
              }
              (*local_c8->xClose)(local_e0);
            }
            else {
              bVar3 = true;
              pFVar13 = (Fts3Expr *)0x0;
              iVar6 = (int)local_108;
            }
            iVar5 = iVar5 + iVar9;
            pbVar11 = local_f8;
            pFVar16 = local_c0;
          }
LAB_0016ab3d:
          pbVar20 = local_d8;
          pFVar17 = pFVar16;
          if ((uVar7 == 0) && (pFVar13 != (Fts3Expr *)0x0)) {
            iVar9 = pFVar13->eType;
            if (iVar9 != 5) {
              bVar31 = pFVar13->pLeft == (Fts3Expr *)0x0;
              bVar3 = !bVar31;
              if (!bVar31 || local_b0 == 0) goto LAB_0016abc0;
LAB_0016b073:
              pbVar11 = local_f8;
              sqlite3Fts3ExprFree(pFVar13);
              uVar24 = local_e8;
              goto LAB_0016b08b;
            }
            if (!bVar3) {
              pFVar17 = (Fts3Expr *)fts3MallocZero(0x40);
              if (pFVar17 == (Fts3Expr *)0x0) {
                local_e8 = 7;
                goto LAB_0016b073;
              }
              pFVar17->eType = 2;
              pFVar17->pRight = pFVar13;
              pFVar13->pParent = pFVar17;
              uVar7 = 0;
              pbVar11 = local_f8;
              pbVar20 = local_d8;
              if (pFVar16 != (Fts3Expr *)0x0) {
                pFVar17->pLeft = pFVar16;
                pFVar16->pParent = pFVar17;
              }
              goto LAB_0016ab7b;
            }
            bVar3 = true;
            bVar31 = false;
LAB_0016abc0:
            if (local_b0 == 0 && bVar31 == false) {
              pNew = (Fts3Expr *)fts3MallocZero(0x40);
              if (pNew == (Fts3Expr *)0x0) {
                local_e8 = 7;
                goto LAB_0016b073;
              }
              pNew->eType = 3;
              insertBinaryOperator((Fts3Expr **)&local_d0,local_f0,pNew);
              local_f0 = pNew;
LAB_0016ac10:
              if (((!(bool)(iVar9 != 1 | bVar3)) && (local_f0->eType != 5)) ||
                 ((!(bool)(bVar3 ^ 1U | iVar9 == 5) && (local_f0->eType == 1)))) goto LAB_0016b073;
            }
            else {
              if (local_f0 != (Fts3Expr *)0x0) goto LAB_0016ac10;
              local_f0 = (Fts3Expr *)0x0;
            }
            pbVar20 = local_d8;
            pbVar11 = local_f8;
            if (bVar3) {
              pFVar16 = pFVar13;
              if (local_d0 != (Fts3Expr *)0x0) {
                local_f0->pRight = pFVar13;
                pFVar13->pParent = local_f0;
                pFVar16 = local_d0;
              }
            }
            else {
              insertBinaryOperator((Fts3Expr **)&local_d0,local_f0,pFVar13);
              pFVar16 = local_d0;
            }
            local_d0 = pFVar16;
            local_b0 = (uint)bVar31;
            uVar7 = 0;
            iVar6 = (int)local_108;
            local_f0 = pFVar13;
          }
        }
        else {
          uVar7 = 0x65;
LAB_0016a312:
          iVar6 = (int)uVar12;
          pbVar20 = local_d8;
          pFVar17 = local_c0;
        }
LAB_0016ab7b:
        uVar12 = (ulong)(uint)(iVar6 - iVar5);
        pbVar20 = pbVar20 + iVar5;
        pFVar16 = pFVar17;
      }
      uVar8 = 1;
      local_e8 = 1;
      uVar24 = uVar7;
      if (local_b0 != 0) {
        uVar24 = uVar8;
      }
      if (local_d0 == (Fts3Expr *)0x0) {
        uVar24 = uVar7;
      }
      if (uVar7 != 0x65) {
        uVar24 = uVar7;
      }
      if (uVar24 != 0x65) {
LAB_0016b08b:
        local_e8 = uVar24;
        ppFVar19 = local_68;
        sqlite3Fts3ExprFree(local_d0);
        sqlite3Fts3ExprFree(pFVar16);
        *ppFVar19 = (Fts3Expr *)0x0;
        pFVar16 = (Fts3Expr *)0x0;
LAB_0016b0a1:
        sqlite3Fts3ExprFree(pFVar16);
        *ppFVar19 = (Fts3Expr *)0x0;
        if (local_e8 == 1) {
          pcVar18 = sqlite3_mprintf("malformed MATCH expression: [%s]",pbVar11);
        }
        else {
          if (local_e8 != 0x12) {
            return local_e8;
          }
          pcVar18 = sqlite3_mprintf("FTS expression tree is too large (maximum depth %d)",0xc);
        }
        (local_a0->base).zErrMsg = pcVar18;
        return 1;
      }
      pFVar13 = pFVar16;
      if (pFVar16 == (Fts3Expr *)0x0 || local_d0 == (Fts3Expr *)0x0) {
        pFVar13 = local_d0;
        uVar24 = uVar8;
        if (pFVar16 != (Fts3Expr *)0x0) goto LAB_0016b08b;
      }
      else {
        do {
          pFVar17 = pFVar13;
          pFVar13 = pFVar17->pLeft;
        } while (pFVar17->pLeft != (Fts3Expr *)0x0);
        pFVar17->pLeft = local_d0;
        local_d0->pParent = pFVar17;
        pFVar13 = pFVar16;
      }
      *local_68 = pFVar13;
      if (pFVar13 == (Fts3Expr *)0x0) {
        pFVar16 = (Fts3Expr *)0x0;
      }
      else {
        local_e8 = uVar8;
        local_e8 = fts3ExprBalance(local_68,0xc);
        pFVar16 = *ppFVar19;
        if ((local_e8 != 0) || (local_e8 = fts3ExprCheckDepth(pFVar16,0xc), local_e8 != 0))
        goto LAB_0016b0a1;
        local_e8 = 0;
      }
    }
    psVar2 = (local_110->base).pVtab;
    local_d0 = (Fts3Expr *)((ulong)local_d0._4_4_ << 0x20);
    nByte = 0;
    iBegin = 0;
    fts3EvalAllocateReaders(local_110,pFVar16,&nByte,&iBegin,(int *)&local_d0);
    if ((1 < nByte && (int)local_d0 == 0) && (psVar2[0x12].field_0xc != '\0')) {
      uVar12 = (ulong)(uint)nByte;
      aTC = (Fts3TokenAndCost *)sqlite3_malloc(iBegin * 0x10 + nByte * 0x28);
      if (aTC == (Fts3TokenAndCost *)0x0) {
        local_d0 = (Fts3Expr *)CONCAT44(local_d0._4_4_,7);
      }
      else {
        pFVar22 = aTC + uVar12;
        pCursor_1 = (sqlite3_tokenizer_cursor *)aTC;
        zByte = (char *)pFVar22;
        fts3EvalTokenCosts(local_110,(Fts3Expr *)0x0,local_110->pExpr,
                           (Fts3TokenAndCost **)&pCursor_1,(Fts3Expr ***)&zByte,(int *)&local_d0);
        if ((int)local_d0 == 0) {
          uVar12 = (long)zByte - (long)pFVar22;
          iVar5 = (int)(((long)pCursor_1 - (long)aTC) / 0x28);
          iVar9 = fts3EvalSelectDeferred(local_110,(Fts3Expr *)0x0,aTC,iVar5);
          for (lVar28 = 0; (iVar9 == 0 && (lVar28 < (int)(uVar12 >> 3))); lVar28 = lVar28 + 1) {
            iVar9 = fts3EvalSelectDeferred
                              (local_110,(Fts3Expr *)(&pFVar22->pPhrase)[lVar28],aTC,iVar5);
          }
          local_d0 = (Fts3Expr *)CONCAT44(local_d0._4_4_,iVar9);
        }
        sqlite3_free(aTC);
      }
    }
    pCursor_00 = local_110;
    fts3EvalStartReaders(local_110,local_110->pExpr,(int *)&local_d0);
    iVar9 = (int)local_d0;
    sqlite3Fts3SegmentsClose(local_a0);
    if (iVar9 != 0) {
      return iVar9;
    }
    pCursor_00->pNextId = pCursor_00->aDoclist;
    pCursor_00->iPrevId = 0;
  }
  ppStmt = &pCursor_00->pStmt;
  if ((short)local_98 == 1) {
    iVar9 = fts3CursorSeekStmt(local_110,ppStmt);
    if (iVar9 != 0) {
      return iVar9;
    }
    iVar9 = sqlite3_bind_value(*ppStmt,1,local_60);
  }
  else {
    if ((local_98 & 0xffff) != 0) goto LAB_0016b055;
    local_78 = (sqlite3_value *)((ulong)local_78 | (ulong)local_58);
    if (local_78 == (sqlite3_value *)0x0) {
      pcVar18 = "DESC";
      if (pCursor_00->bDesc == '\0') {
        pcVar18 = "ASC";
      }
      pcVar18 = sqlite3_mprintf("SELECT %s ORDER BY rowid %s",local_a0->zReadExprlist,pcVar18);
    }
    else {
      pcVar18 = sqlite3_mprintf("SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
                                local_a0->zReadExprlist,pCursor_00->iMinDocid,pCursor_00->iMaxDocid)
      ;
    }
    if (pcVar18 == (char *)0x0) {
      return 7;
    }
    iVar9 = sqlite3_prepare_v2(local_a0->db,pcVar18,-1,ppStmt,(char **)0x0);
    sqlite3_free(pcVar18);
  }
  pCursor_00 = local_110;
  if (iVar9 != 0) {
    return iVar9;
  }
LAB_0016b055:
  iVar9 = fts3NextMethod(&pCursor_00->base);
  return iVar9;
}

Assistant:

static int fts3FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_OK;
  char *zSql;                     /* SQL statement used to access %_content */
  int eSearch;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;

  sqlite3_value *pCons = 0;       /* The MATCH or rowid constraint, if any */
  sqlite3_value *pLangid = 0;     /* The "langid = ?" constraint, if any */
  sqlite3_value *pDocidGe = 0;    /* The "docid >= ?" constraint, if any */
  sqlite3_value *pDocidLe = 0;    /* The "docid <= ?" constraint, if any */
  int iIdx;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  eSearch = (idxNum & 0x0000FFFF);
  assert( eSearch>=0 && eSearch<=(FTS3_FULLTEXT_SEARCH+p->nColumn) );
  assert( p->pSegments==0 );

  /* Collect arguments into local variables */
  iIdx = 0;
  if( eSearch!=FTS3_FULLSCAN_SEARCH ) pCons = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_LANGID ) pLangid = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_GE ) pDocidGe = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_LE ) pDocidLe = apVal[iIdx++];
  assert( iIdx==nVal );

  /* In case the cursor has been used before, clear it now. */
  sqlite3_finalize(pCsr->pStmt);
  sqlite3_free(pCsr->aDoclist);
  sqlite3_free(pCsr->aMatchinfo);
  sqlite3Fts3ExprFree(pCsr->pExpr);
  memset(&pCursor[1], 0, sizeof(Fts3Cursor)-sizeof(sqlite3_vtab_cursor));

  /* Set the lower and upper bounds on docids to return */
  pCsr->iMinDocid = fts3DocidRange(pDocidGe, SMALLEST_INT64);
  pCsr->iMaxDocid = fts3DocidRange(pDocidLe, LARGEST_INT64);

  if( idxStr ){
    pCsr->bDesc = (idxStr[0]=='D');
  }else{
    pCsr->bDesc = p->bDescIdx;
  }
  pCsr->eSearch = (i16)eSearch;

  if( eSearch!=FTS3_DOCID_SEARCH && eSearch!=FTS3_FULLSCAN_SEARCH ){
    int iCol = eSearch-FTS3_FULLTEXT_SEARCH;
    const char *zQuery = (const char *)sqlite3_value_text(pCons);

    if( zQuery==0 && sqlite3_value_type(pCons)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }

    pCsr->iLangid = 0;
    if( pLangid ) pCsr->iLangid = sqlite3_value_int(pLangid);

    assert( p->base.zErrMsg==0 );
    rc = sqlite3Fts3ExprParse(p->pTokenizer, pCsr->iLangid,
        p->azColumn, p->bFts4, p->nColumn, iCol, zQuery, -1, &pCsr->pExpr, 
        &p->base.zErrMsg
    );
    if( rc!=SQLITE_OK ){
      return rc;
    }

    rc = fts3EvalStart(pCsr);
    sqlite3Fts3SegmentsClose(p);
    if( rc!=SQLITE_OK ) return rc;
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }

  /* Compile a SELECT statement for this cursor. For a full-table-scan, the
  ** statement loops through all rows of the %_content table. For a
  ** full-text query or docid lookup, the statement retrieves a single
  ** row by docid.
  */
  if( eSearch==FTS3_FULLSCAN_SEARCH ){
    if( pDocidGe || pDocidLe ){
      zSql = sqlite3_mprintf(
          "SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
          p->zReadExprlist, pCsr->iMinDocid, pCsr->iMaxDocid,
          (pCsr->bDesc ? "DESC" : "ASC")
      );
    }else{
      zSql = sqlite3_mprintf("SELECT %s ORDER BY rowid %s", 
          p->zReadExprlist, (pCsr->bDesc ? "DESC" : "ASC")
      );
    }
    if( zSql ){
      rc = sqlite3_prepare_v2(p->db, zSql, -1, &pCsr->pStmt, 0);
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }else if( eSearch==FTS3_DOCID_SEARCH ){
    rc = fts3CursorSeekStmt(pCsr, &pCsr->pStmt);
    if( rc==SQLITE_OK ){
      rc = sqlite3_bind_value(pCsr->pStmt, 1, pCons);
    }
  }
  if( rc!=SQLITE_OK ) return rc;

  return fts3NextMethod(pCursor);
}